

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall ghc::filesystem::path::compare(path *this,path *p)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  ulong in_RSI;
  path *in_RDI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter1;
  bool hrd2;
  bool hrd1;
  int rnc;
  size_type rnl2;
  size_type rnl1;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  string *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined1 local_2e;
  byte local_2d;
  int local_2c;
  size_type local_28;
  string *local_20;
  ulong local_18;
  int local_4;
  
  local_18 = in_RSI;
  local_20 = (string *)root_name_length(in_RDI);
  local_28 = root_name_length(in_RDI);
  this_00 = local_20;
  std::min<unsigned_long>((unsigned_long *)&local_20,&local_28);
  local_2c = std::__cxx11::string::compare((ulong)in_RDI,0,this_00,local_18,0);
  local_4 = local_2c;
  if (local_2c == 0) {
    local_2d = has_root_directory((path *)this_00);
    local_2e = has_root_directory((path *)this_00);
    if ((local_2d & 1) == local_2e) {
      if ((local_2d & 1) != 0) {
        local_20 = local_20 + 1;
        local_28 = local_28 + 1;
      }
      local_40 = std::__cxx11::string::begin();
      local_38 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_RDI,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                            );
      std::__cxx11::string::begin();
      local_48 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_RDI,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                            );
      while( true ) {
        std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 & 0xffffff;
        if (bVar1) {
          std::__cxx11::string::end();
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 & 0xffffff;
          if (bVar1) {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_38);
            in_stack_ffffffffffffff60 = (int)*pcVar3;
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_48);
            in_stack_ffffffffffffff64 =
                 CONCAT13(in_stack_ffffffffffffff60 == *pcVar3,(int3)in_stack_ffffffffffffff64);
          }
        }
        if ((char)(in_stack_ffffffffffffff64 >> 0x18) == '\0') break;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_38);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_48);
      }
      std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if (bVar1) {
        std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_4 = -1;
        if (bVar1) {
          local_4 = 0;
        }
      }
      else {
        std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        if (bVar1) {
          local_4 = 1;
        }
        else {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_38);
          if (*pcVar3 == '/') {
            local_4 = -1;
          }
          else {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_48);
            if (*pcVar3 == '/') {
              local_4 = 1;
            }
            else {
              pcVar3 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_38);
              iVar2 = (int)*pcVar3;
              pcVar3 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_48);
              local_4 = 1;
              if (iVar2 < *pcVar3) {
                local_4 = -1;
              }
            }
          }
        }
      }
    }
    else {
      local_4 = -1;
      if ((local_2d & 1) != 0) {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

GHC_INLINE int path::compare(const path& p) const noexcept
{
#ifdef LWG_2936_BEHAVIOUR
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
#ifdef GHC_OS_WINDOWS
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
#else
    auto rnc = _path.compare(0, rnl1, p._path, 0, (std::min(rnl1, rnl2)));
#endif
    if (rnc) {
        return rnc;
    }
    bool hrd1 = has_root_directory(), hrd2 = p.has_root_directory();
    if (hrd1 != hrd2) {
        return hrd1 ? 1 : -1;
    }
    if (hrd1) {
        ++rnl1;
        ++rnl2;
    }
    auto iter1 = _path.begin() + static_cast<int>(rnl1);
    auto iter2 = p._path.begin() + static_cast<int>(rnl2);
    while (iter1 != _path.end() && iter2 != p._path.end() && *iter1 == *iter2) {
        ++iter1;
        ++iter2;
    }
    if (iter1 == _path.end()) {
        return iter2 == p._path.end() ? 0 : -1;
    }
    if (iter2 == p._path.end()) {
        return 1;
    }
    if (*iter1 == preferred_separator) {
        return -1;
    }
    if (*iter2 == preferred_separator) {
        return 1;
    }
    return *iter1 < *iter2 ? -1 : 1;
#else  // LWG_2936_BEHAVIOUR
#ifdef GHC_OS_WINDOWS
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
    if (rnc) {
        return rnc;
    }
    return _path.compare(rnl1, std::string::npos, p._path, rnl2, std::string::npos);
#else
    return _path.compare(p._path);
#endif
#endif
}